

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O1

void __thiscall QSidebar::selectUrl(QSidebar *this,QUrl *url)

{
  char cVar1;
  int iVar2;
  QItemSelectionModel *pQVar3;
  QAbstractItemModel *pQVar4;
  undefined4 *puVar5;
  int iVar6;
  long in_FS_OFFSET;
  QObject local_98 [8];
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QSlotObjectBase local_78;
  long *plStack_68;
  QUrl local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_58.shared = (PrivateShared *)QItemSelectionModel::currentChanged;
  iVar6 = 0;
  local_58._8_8_ = 0;
  local_78._0_8_ = clicked;
  local_78.m_impl = (ImplFn)0x0;
  QObject::disconnectImpl
            ((QObject *)pQVar3,&local_58.shared,(QObject *)this,(void **)&local_78,
             (QMetaObject *)&QItemSelectionModel::staticMetaObject);
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  (**(code **)(*(long *)pQVar3 + 0x78))(pQVar3);
  pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
  local_58._forAlignment = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar2 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&local_58);
  if (0 < iVar2) {
    do {
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      local_90 = 0xffffffffffffffff;
      local_88 = 0;
      uStack_80 = 0;
      (**(code **)(*(long *)pQVar4 + 0x60))(&local_78,pQVar4,iVar6,0,&local_90);
      if (plStack_68 == (long *)0x0) {
        local_58.shared = (PrivateShared *)0x0;
        local_58._8_8_ = 0;
        local_58._16_8_ = 0;
        local_40 = 2;
      }
      else {
        (**(code **)(*plStack_68 + 0x90))(&local_58,plStack_68,&local_78,0x101);
      }
      ::QVariant::toUrl();
      cVar1 = comparesEqual(&local_60,url);
      QUrl::~QUrl(&local_60);
      ::QVariant::~QVariant((QVariant *)&local_58);
      if (cVar1 != '\0') {
        pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
        pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
        local_78._0_8_ = (code *)0xffffffffffffffff;
        local_78.m_impl = (ImplFn)0x0;
        plStack_68 = (long *)0x0;
        (**(code **)(*(long *)pQVar4 + 0x60))(&local_58,pQVar4,iVar6,0);
        (**(code **)(*(long *)pQVar3 + 0x68))(pQVar3,&local_58,2);
        break;
      }
      iVar6 = iVar6 + 1;
      pQVar4 = QAbstractItemView::model((QAbstractItemView *)this);
      local_58._forAlignment = -NAN;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      iVar2 = (**(code **)(*(long *)pQVar4 + 0x78))(pQVar4,&local_58);
    } while (iVar6 < iVar2);
  }
  pQVar3 = QAbstractItemView::selectionModel((QAbstractItemView *)this);
  local_78._0_8_ = clicked;
  local_78.m_impl = (ImplFn)0x0;
  local_58.shared = (PrivateShared *)QItemSelectionModel::currentChanged;
  local_58._8_8_ = 0;
  puVar5 = (undefined4 *)operator_new(0x20);
  *puVar5 = 1;
  *(code **)(puVar5 + 2) =
       QtPrivate::
       QCallableObject<void_(QSidebar::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar5 + 4) = clicked;
  *(undefined8 *)(puVar5 + 6) = 0;
  QObject::connectImpl
            (local_98,(void **)pQVar3,(QObject *)local_58.data,(void **)this,&local_78,
             (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_98);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSidebar::selectUrl(const QUrl &url)
{
    disconnect(selectionModel(), &QItemSelectionModel::currentChanged,
               this, &QSidebar::clicked);

    selectionModel()->clear();
    for (int i = 0; i < model()->rowCount(); ++i) {
        if (model()->index(i, 0).data(QUrlModel::UrlRole).toUrl() == url) {
            selectionModel()->select(model()->index(i, 0), QItemSelectionModel::Select);
            break;
        }
    }

    connect(selectionModel(), &QItemSelectionModel::currentChanged,
            this, &QSidebar::clicked);
}